

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

StringPtr kj::stringifyStackTraceAddresses(ArrayPtr<void_*const> trace,ArrayPtr<char> scratch)

{
  size_t in_R8;
  ArrayPtr<const_char> AVar1;
  ArrayPtr<char> buffer;
  StringPtr delim;
  StringPtr local_88;
  Delimited<kj::ArrayPtr<void_*const>_&> local_78;
  kj *local_48;
  char *pcStack_40;
  kj *pkStack_38;
  ArrayPtr<char> scratch_local;
  ArrayPtr<void_*const> trace_local;
  
  scratch_local.size_ = (size_t)trace.ptr;
  pcStack_40 = (char *)scratch.size_;
  local_48 = (kj *)scratch.ptr;
  pkStack_38 = local_48;
  scratch_local.ptr = pcStack_40;
  StringPtr::StringPtr(&local_88," ");
  delim.content.size_ = in_R8;
  delim.content.ptr = (char *)local_88.content.size_;
  delimited<kj::ArrayPtr<void*const>&>
            (&local_78,(kj *)&scratch_local.size_,(ArrayPtr<void_*const> *)local_88.content.ptr,
             delim);
  buffer.size_ = (size_t)&local_78;
  buffer.ptr = pcStack_40;
  AVar1 = (ArrayPtr<const_char>)
          strPreallocated<kj::_::Delimited<kj::ArrayPtr<void*const>&>>
                    (local_48,buffer,
                     (Delimited<kj::ArrayPtr<void_*const>_&> *)local_88.content.size_);
  _::Delimited<kj::ArrayPtr<void_*const>_&>::~Delimited(&local_78);
  return (StringPtr)AVar1;
}

Assistant:

StringPtr stringifyStackTraceAddresses(ArrayPtr<void* const> trace, ArrayPtr<char> scratch) {
  // Version which writes into a pre-allocated buffer. This is safe for signal handlers to the
  // extent that dladdr() is safe.
  //
  // TODO(cleanup): We should improve the KJ stringification framework so that there's a way to
  //   write this string directly into a larger message buffer with strPreallocated().

#if KJ_HAS_LIBDL
  char* ptr = scratch.begin();
  char* limit = scratch.end() - 1;

  for (auto addr: trace) {
    Dl_info info;
    // Shared libraries are mapped near the end of the address space while the executable is mapped
    // near the beginning. We want to print addresses in the executable as raw addresses, not
    // offsets, since that's what addr2line expects for executables. For shared libraries it
    // expects offsets. In any case, most frames are likely to be in the main executable so it
    // makes the output cleaner if we don't repeatedly write its name.
    if (reinterpret_cast<uintptr_t>(addr) >= 0x400000000000ull && dladdr(addr, &info)) {
      uintptr_t offset = reinterpret_cast<uintptr_t>(addr) -
                         reinterpret_cast<uintptr_t>(info.dli_fbase);
      ptr = _::fillLimited(ptr, limit, kj::StringPtr(info.dli_fname), "@0x"_kj, hex(offset));
    } else {
      ptr = _::fillLimited(ptr, limit, toCharSequence(addr));
    }

    ptr = _::fillLimited(ptr, limit, " "_kj);
  }
  *ptr = '\0';
  return StringPtr(scratch.begin(), ptr);
#else
  // TODO(someday): Support other platforms.
  return kj::strPreallocated(scratch, kj::delimited(trace, " "));
#endif
}